

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ecdsa_recoverable_signature_convert
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,
              secp256k1_ecdsa_recoverable_signature *sigin)

{
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_scalar sStack_28;
  secp256k1_scalar local_24;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_recoverable_signature_convert_cold_3();
  }
  else if (sig != (secp256k1_ecdsa_signature *)0x0) {
    if (sigin == (secp256k1_ecdsa_recoverable_signature *)0x0) {
      secp256k1_ecdsa_recoverable_signature_convert_cold_1();
      return 0;
    }
    secp256k1_scalar_set_b32(&local_24,sigin->data,(int *)0x0);
    secp256k1_scalar_set_b32(&sStack_28,sigin->data + 0x20,(int *)0x0);
    secp256k1_ecdsa_signature_save(sig,&local_24,&sStack_28);
    return 1;
  }
  secp256k1_ecdsa_recoverable_signature_convert_cold_2();
  return 0;
}

Assistant:

int secp256k1_ecdsa_recoverable_signature_convert(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const secp256k1_ecdsa_recoverable_signature* sigin) {
    secp256k1_scalar r, s;
    int recid;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(sigin != NULL);

    secp256k1_ecdsa_recoverable_signature_load(ctx, &r, &s, &recid, sigin);
    secp256k1_ecdsa_signature_save(sig, &r, &s);
    return 1;
}